

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O2

void __thiscall PrintfTest_Pointer_Test::TestBody(PrintfTest_Pointer_Test *this)

{
  Message *pMVar1;
  void **in_RCX;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args;
  void **ppvVar2;
  char *pcVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_00;
  char **args_01;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_02;
  wchar_t *pwVar4;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_03;
  wchar_t **args_04;
  char *pcVar5;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  wstring_view format_09;
  wstring_view format_10;
  wstring_view format_11;
  wstring_view format_12;
  wstring_view format_13;
  wstring_view format_14;
  wstring_view format_15;
  wstring_view format_16;
  wstring_view format_17;
  wstring_view format_18;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a8;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  void *p;
  wchar_t *null_wstr;
  undefined1 local_38 [8];
  wchar_t *w;
  char *s;
  char *null_str;
  int n;
  
  args = &local_a8;
  args_00 = &local_a8;
  args_02 = &local_a8;
  args_03 = &local_a8;
  p = &n;
  fmt::v5::format<char[3],void*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
             (v5 *)0x1a1697,(char (*) [3])&p,in_RCX);
  format.size_ = 2;
  format.data_ = "%p";
  test_sprintf<void*>((string *)&gtest_ar_2,format,&p);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"fmt::format(\"{}\", p)","test_sprintf(\"%p\", p)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"format: ");
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"%p");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    args = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x1c4;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::format<char[3],void*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
             (v5 *)0x1a1697,(char (*) [3])&p,(void **)args);
  format_00.size_ = 2;
  format_00.data_ = "%p";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_00);
  fmt::v5::sprintf<std::__cxx11::string,void*>
            ((type *)&gtest_ar_2,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,(void **)args);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&null_wstr,"fmt::format(\"{}\", p)",
             "fmt::sprintf(make_positional(\"%p\"), p)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((char)null_wstr == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if (local_38 == (undefined1  [8])0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_38;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_38);
  p = (void *)0x0;
  format_01.size_ = 2;
  format_01.data_ = "%p";
  test_sprintf<void*>((string *)&local_a8,format_01,&p);
  ppvVar2 = (void **)0x19b81a;
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"(nil)\"","test_sprintf(\"%p\", p)",(char (*) [6])0x19b81a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"format: ");
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"%p");
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    ppvVar2 = (void **)0x1c6;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  format_02.size_ = 2;
  format_02.data_ = "%p";
  make_positional_abi_cxx11_((string *)&gtest_ar_2,format_02);
  fmt::v5::sprintf<std::__cxx11::string,void*>
            ((type *)&local_a8,(v5 *)&gtest_ar_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,ppvVar2);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"(nil)\"","fmt::sprintf(make_positional(\"%p\"), p)",
             (char (*) [6])0x19b81a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_03.size_ = 4;
  format_03.data_ = "%10p";
  test_sprintf<void*>((string *)&local_a8,format_03,&p);
  pcVar3 = "     (nil)";
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"     (nil)\"","test_sprintf(\"%10p\", p)",
             (char (*) [11])"     (nil)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"format: ");
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"%10p");
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x1c7;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  format_04.size_ = 4;
  format_04.data_ = "%10p";
  make_positional_abi_cxx11_((string *)&gtest_ar_2,format_04);
  fmt::v5::sprintf<std::__cxx11::string,void*>
            ((type *)&local_a8,(v5 *)&gtest_ar_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,(void **)pcVar3
            );
  pcVar3 = "     (nil)";
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"     (nil)\"","fmt::sprintf(make_positional(\"%10p\"), p)",
             (char (*) [11])"     (nil)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x1c7;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  s = "test";
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
             (v5 *)"{:p}",(char (*) [5])&s,(char **)pcVar3);
  format_05.size_ = 2;
  format_05.data_ = "%p";
  test_sprintf<char_const*>((string *)&gtest_ar_2,format_05,&s);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"fmt::format(\"{:p}\", s)","test_sprintf(\"%p\", s)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"format: ");
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"%p");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    args_00 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x1c9;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::format<char[5],char_const*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
             (v5 *)"{:p}",(char (*) [5])&s,(char **)args_00);
  format_06.size_ = 2;
  format_06.data_ = "%p";
  make_positional_abi_cxx11_((string *)&gtest_ar,format_06);
  fmt::v5::sprintf<std::__cxx11::string,char_const*>
            ((type *)&gtest_ar_2,(v5 *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
             (char **)args_00);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&null_wstr,"fmt::format(\"{:p}\", s)",
             "fmt::sprintf(make_positional(\"%p\"), s)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((char)null_wstr == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if (local_38 == (undefined1  [8])0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_38;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1c9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_38);
  null_str = (char *)0x0;
  format_07.size_ = 2;
  format_07.data_ = "%p";
  test_sprintf<char_const*>((string *)&local_a8,format_07,&null_str);
  args_01 = (char **)0x19b81a;
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"(nil)\"","test_sprintf(\"%p\", null_str)",
             (char (*) [6])0x19b81a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"format: ");
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"%p");
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    args_01 = (char **)0x1cb;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1cb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  format_08.size_ = 2;
  format_08.data_ = "%p";
  make_positional_abi_cxx11_((string *)&gtest_ar_2,format_08);
  fmt::v5::sprintf<std::__cxx11::string,char_const*>
            ((type *)&local_a8,(v5 *)&gtest_ar_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&null_str,args_01)
  ;
  ppvVar2 = (void **)0x19b81a;
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"(nil)\"","fmt::sprintf(make_positional(\"%p\"), null_str)",
             (char (*) [6])0x19b81a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    ppvVar2 = (void **)0x1cb;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1cb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  p = &n;
  fmt::v5::format<wchar_t[3],void*>(&local_a8,(v5 *)L"{}",(wchar_t (*) [3])&p,ppvVar2);
  format_09.size_ = 2;
  format_09.data_ = L"%p";
  test_sprintf<void*>((wstring *)&gtest_ar_2,format_09,&p);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)&gtest_ar,"fmt::format(L\"{}\", p)","test_sprintf(L\"%p\", p)",&local_a8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             &gtest_ar_2);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar_2);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"format: ");
    pMVar1 = testing::Message::operator<<((Message *)&local_a8,L"%p");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    args_02 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x1ce;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1ce,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,pMVar1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::format<wchar_t[3],void*>(&local_a8,(v5 *)L"{}",(wchar_t (*) [3])&p,(void **)args_02);
  format_10.size_ = 2;
  format_10.data_ = L"%p";
  make_positional_abi_cxx11_((wstring *)&gtest_ar,format_10);
  fmt::v5::sprintf<std::__cxx11::wstring,void*>
            ((type *)&gtest_ar_2,(v5 *)&gtest_ar,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&p,
             (void **)args_02);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)&null_wstr,"fmt::format(L\"{}\", p)",
             "fmt::sprintf(make_positional(L\"%p\"), p)",&local_a8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             &gtest_ar_2);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar_2);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  if ((char)null_wstr == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if (local_38 == (undefined1  [8])0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_38;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1ce,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_38);
  p = (void *)0x0;
  format_11.size_ = 2;
  format_11.data_ = L"%p";
  test_sprintf<void*>(&local_a8,format_11,&p);
  ppvVar2 = (void **)0x19c47c;
  testing::internal::CmpHelperEQ<wchar_t[6],std::__cxx11::wstring>
            ((internal *)&gtest_ar_2,"L\"(nil)\"","test_sprintf(L\"%p\", p)",
             (wchar_t (*) [6])0x19c47c,&local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"format: ");
    pMVar1 = testing::Message::operator<<((Message *)&local_a8,L"%p");
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    ppvVar2 = (void **)0x1d0;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,pMVar1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  format_12.size_ = 2;
  format_12.data_ = L"%p";
  make_positional_abi_cxx11_((wstring *)&gtest_ar_2,format_12);
  fmt::v5::sprintf<std::__cxx11::wstring,void*>
            (&local_a8,(v5 *)&gtest_ar_2,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&p,
             ppvVar2);
  testing::internal::CmpHelperEQ<wchar_t[6],std::__cxx11::wstring>
            ((internal *)&gtest_ar,"L\"(nil)\"","fmt::sprintf(make_positional(L\"%p\"), p)",
             (wchar_t (*) [6])0x19c47c,&local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  format_13.size_ = 4;
  format_13.data_ = L"%10p";
  test_sprintf<void*>(&local_a8,format_13,&p);
  pwVar4 = L"     (nil)";
  testing::internal::CmpHelperEQ<wchar_t[11],std::__cxx11::wstring>
            ((internal *)&gtest_ar_2,"L\"     (nil)\"","test_sprintf(L\"%10p\", p)",
             (wchar_t (*) [11])L"     (nil)",&local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"format: ");
    pMVar1 = testing::Message::operator<<((Message *)&local_a8,L"%10p");
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    pwVar4 = (wchar_t *)0x1d1;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,pMVar1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  format_14.size_ = 4;
  format_14.data_ = L"%10p";
  make_positional_abi_cxx11_((wstring *)&gtest_ar_2,format_14);
  fmt::v5::sprintf<std::__cxx11::wstring,void*>
            (&local_a8,(v5 *)&gtest_ar_2,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&p,
             (void **)pwVar4);
  pwVar4 = L"     (nil)";
  testing::internal::CmpHelperEQ<wchar_t[11],std::__cxx11::wstring>
            ((internal *)&gtest_ar,"L\"     (nil)\"","fmt::sprintf(make_positional(L\"%10p\"), p)",
             (wchar_t (*) [11])L"     (nil)",&local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pwVar4 = (wchar_t *)0x1d1;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  w = L"test";
  fmt::v5::format<wchar_t[5],wchar_t_const*>
            (&local_a8,(v5 *)L"{:p}",(wchar_t (*) [5])&w,(wchar_t **)pwVar4);
  format_15.size_ = 2;
  format_15.data_ = L"%p";
  test_sprintf<wchar_t_const*>((wstring *)&gtest_ar_2,format_15,&w);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)&gtest_ar,"fmt::format(L\"{:p}\", w)","test_sprintf(L\"%p\", w)",&local_a8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             &gtest_ar_2);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar_2);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"format: ");
    pMVar1 = testing::Message::operator<<((Message *)&local_a8,L"%p");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    args_03 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x1d3;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,pMVar1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::format<wchar_t[5],wchar_t_const*>
            (&local_a8,(v5 *)L"{:p}",(wchar_t (*) [5])&w,(wchar_t **)args_03);
  format_16.size_ = 2;
  format_16.data_ = L"%p";
  make_positional_abi_cxx11_((wstring *)&gtest_ar,format_16);
  fmt::v5::sprintf<std::__cxx11::wstring,wchar_t_const*>
            ((type *)&gtest_ar_2,(v5 *)&gtest_ar,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&w,
             (wchar_t **)args_03);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)&null_wstr,"fmt::format(L\"{:p}\", w)",
             "fmt::sprintf(make_positional(L\"%p\"), w)",&local_a8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             &gtest_ar_2);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar_2);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  if ((char)null_wstr == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if (local_38 == (undefined1  [8])0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_38;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_38);
  null_wstr = (wchar_t *)0x0;
  format_17.size_ = 2;
  format_17.data_ = L"%p";
  test_sprintf<wchar_t_const*>(&local_a8,format_17,&null_wstr);
  args_04 = (wchar_t **)0x19c47c;
  testing::internal::CmpHelperEQ<wchar_t[6],std::__cxx11::wstring>
            ((internal *)&gtest_ar_2,"L\"(nil)\"","test_sprintf(L\"%p\", null_wstr)",
             (wchar_t (*) [6])0x19c47c,&local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 4),"format: ");
    pMVar1 = testing::Message::operator<<((Message *)&local_a8,L"%p");
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    args_04 = (wchar_t **)0x1d5;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,pMVar1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  format_18.size_ = 2;
  format_18.data_ = L"%p";
  make_positional_abi_cxx11_((wstring *)&gtest_ar_2,format_18);
  fmt::v5::sprintf<std::__cxx11::wstring,wchar_t_const*>
            (&local_a8,(v5 *)&gtest_ar_2,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             &null_wstr,args_04);
  testing::internal::CmpHelperEQ<wchar_t[6],std::__cxx11::wstring>
            ((internal *)&gtest_ar,"L\"(nil)\"","fmt::sprintf(make_positional(L\"%p\"), null_wstr)",
             (wchar_t (*) [6])0x19c47c,&local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1d5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(PrintfTest, Pointer) {
  int n;
  void *p = &n;
  EXPECT_PRINTF(fmt::format("{}", p), "%p", p);
  p = FMT_NULL;
  EXPECT_PRINTF("(nil)", "%p", p);
  EXPECT_PRINTF("     (nil)", "%10p", p);
  const char *s = "test";
  EXPECT_PRINTF(fmt::format("{:p}", s), "%p", s);
  const char *null_str = FMT_NULL;
  EXPECT_PRINTF("(nil)", "%p", null_str);

  p = &n;
  EXPECT_PRINTF(fmt::format(L"{}", p), L"%p", p);
  p = FMT_NULL;
  EXPECT_PRINTF(L"(nil)", L"%p", p);
  EXPECT_PRINTF(L"     (nil)", L"%10p", p);
  const wchar_t *w = L"test";
  EXPECT_PRINTF(fmt::format(L"{:p}", w), L"%p", w);
  const wchar_t *null_wstr = FMT_NULL;
  EXPECT_PRINTF(L"(nil)", L"%p", null_wstr);
}